

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::dup
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int __fd)

{
  bool bVar1;
  Data *pDVar2;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> local_20;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *local_18;
  Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this_local;
  
  local_18 = this;
  pDVar2 = d(this);
  bVar1 = AtomicCount::operator==(&pDVar2->rc,1);
  this_local = this;
  if (!bVar1) {
    clone(&local_20,(__fn *)this,__child_stack,in_ECX,in_R8);
    this_local = operator=(this,&local_20);
    ~Array(&local_20);
  }
  return (int)this_local;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}